

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O3

DUH * dumb_read_riff_amff(DUMBFILE *f,riff *stream)

{
  riff_chunk *prVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int32 iVar4;
  DUMB_IT_SIGDATA *sigdata_00;
  IT_PATTERN *pIVar5;
  IT_SAMPLE *pIVar6;
  uchar *puVar7;
  DUH *pDVar8;
  char cVar9;
  uchar uVar10;
  int iVar11;
  uchar uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0) && (stream->type == 0x414d4646)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    if (stream->chunk_count != 0) {
      uVar16 = 0;
      lVar17 = 8;
      uVar13 = 0;
      do {
        prVar1 = stream->chunks;
        iVar11 = *(int *)((long)prVar1 + lVar17 + -8);
        if (iVar11 < 0x4f524452) {
          if (iVar11 == 0x494e5354) {
            if ((*(uint *)((long)&prVar1->type + lVar17) < 0xe1) ||
               (iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4) + 1,0),
               iVar11 != 0)) goto LAB_005ad71b;
            iVar11 = dumbfile_getc(f);
            if (sigdata_00->n_samples <= iVar11) {
              sigdata_00->n_samples = iVar11 + 1;
            }
            if ((0x120 < *(uint *)((long)&prVar1->type + lVar17)) &&
               ((iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4) + 0xe1,0),
                iVar11 != 0 ||
                ((iVar4 = dumbfile_mgetl(f), iVar4 == 0x53414d50 &&
                 (iVar4 = dumbfile_igetl(f), *(uint *)((long)&prVar1->type + lVar17) < iVar4 + 0xe9U
                 )))))) goto LAB_005ad71b;
          }
          else if (iVar11 == 0x4d41494e) {
            if (((uVar13 & 1) != 0) || (*(uint *)((long)&prVar1->type + lVar17) < 0x48))
            goto LAB_005ad71b;
            uVar13 = uVar13 | 1;
          }
        }
        else if (iVar11 == 0x4f524452) {
          if (((uVar13 & 2) != 0) || (*(int *)((long)&prVar1->type + lVar17) == 0))
          goto LAB_005ad71b;
          uVar13 = uVar13 | 2;
        }
        else if (iVar11 == 0x50415454) {
          iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4),0);
          if (iVar11 != 0) goto LAB_005ad71b;
          iVar11 = dumbfile_getc(f);
          if (sigdata_00->n_patterns <= iVar11) {
            sigdata_00->n_patterns = iVar11 + 1;
          }
          iVar4 = dumbfile_igetl(f);
          if (*(uint *)((long)&prVar1->type + lVar17) < iVar4 + 5U) goto LAB_005ad71b;
        }
        uVar16 = uVar16 + 1;
        uVar14 = stream->chunk_count;
        lVar17 = lVar17 + 0x18;
      } while (uVar16 < uVar14);
      if ((((uVar13 == 3) && (sigdata_00->n_samples != 0)) &&
          (uVar13 = sigdata_00->n_patterns, (int)uVar13 < 0x100)) &&
         ((sigdata_00->n_samples < 0x100 && (uVar13 != 0)))) {
        sigdata_00->song_message = (uchar *)0x0;
        sigdata_00->n_orders = 0;
        sigdata_00->n_instruments = 0;
        sigdata_00->order = (uchar *)0x0;
        sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
        sigdata_00->sample = (IT_SAMPLE *)0x0;
        sigdata_00->pattern = (IT_PATTERN *)0x0;
        sigdata_00->midi = (IT_MIDI *)0x0;
        sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
        sigdata_00->mixing_volume = 0x30;
        sigdata_00->pan_separation = 0x80;
        sigdata_00->restart_position = '\0';
        builtin_memcpy(sigdata_00->channel_volume,
                       "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
        iVar11 = (uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f) >>
                       0x25) - ((dumb_it_default_panning_separation << 5) >> 0x1f);
        cVar9 = (char)iVar11;
        uVar12 = ' ' - cVar9;
        uVar10 = cVar9 + ' ';
        uVar16 = (ulong)CONCAT31((int3)((uint)iVar11 >> 8),uVar10);
        uVar15 = 0xfffffffffffffffc;
        do {
          sigdata_00->channel_pan[uVar15 + 4] = uVar12;
          sigdata_00->channel_pan[uVar15 + 5] = uVar10;
          sigdata_00->channel_pan[uVar15 + 6] = uVar10;
          sigdata_00->channel_pan[uVar15 + 7] = uVar12;
          uVar15 = uVar15 + 4;
        } while (uVar15 < 0x3c);
        if (uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          uVar15 = 0;
          do {
            prVar1 = stream->chunks;
            uVar16 = uVar15 * 3;
            if (prVar1[uVar15].type == 0x4d41494e) {
              iVar11 = dumbfile_seek(f,(long)prVar1[uVar15].offset,0);
              if (iVar11 != 0) goto LAB_005ada74;
              dumbfile_getnc((char *)sigdata_00,0x40,f);
              sigdata_00->name[0x40] = '\0';
              sigdata_00->flags = 0x131;
              uVar13 = dumbfile_getc(f);
              if ((uVar13 & 1) == 0) {
                *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
              }
              if ((uVar13 & 0xfffffffe) != 2) goto LAB_005ada74;
              iVar11 = dumbfile_getc(f);
              sigdata_00->n_pchannels = iVar11;
              iVar11 = dumbfile_getc(f);
              sigdata_00->speed = iVar11;
              iVar11 = dumbfile_getc(f);
              sigdata_00->tempo = iVar11;
              dumbfile_skip(f,4);
              iVar11 = dumbfile_getc(f);
              sigdata_00->global_volume = iVar11;
              uVar13 = sigdata_00->n_pchannels + 0x48;
              uVar16 = (ulong)uVar13;
              if (prVar1[uVar15].size < uVar13) goto LAB_005ada74;
              if (0 < sigdata_00->n_pchannels) {
                lVar17 = 0;
                do {
                  iVar11 = dumbfile_getc(f);
                  sigdata_00->channel_pan[lVar17] = (uchar)iVar11;
                  if (0x7f < iVar11) {
                    sigdata_00->channel_volume[lVar17] = '\0';
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 < sigdata_00->n_pchannels);
              }
            }
            uVar15 = uVar15 + 1;
            uVar14 = stream->chunk_count;
          } while (uVar15 < uVar14);
          uVar13 = sigdata_00->n_patterns;
        }
        pIVar5 = (IT_PATTERN *)malloc((long)(int)uVar13 << 4);
        sigdata_00->pattern = pIVar5;
        auVar2 = _DAT_005d6240;
        if (pIVar5 != (IT_PATTERN *)0x0) {
          if (0 < (int)uVar13) {
            lVar17 = (ulong)uVar13 - 1;
            auVar18._8_4_ = (int)lVar17;
            auVar18._0_8_ = lVar17;
            auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
            uVar16 = 0;
            auVar18 = auVar18 ^ _DAT_005d6240;
            auVar19 = _DAT_005d6230;
            do {
              auVar20 = auVar19 ^ auVar2;
              if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                          auVar18._4_4_ < auVar20._4_4_) & 1)) {
                *(undefined8 *)((long)&pIVar5->entry + uVar16) = 0;
              }
              if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
                  auVar20._12_4_ <= auVar18._12_4_) {
                *(undefined8 *)((long)&pIVar5[1].entry + uVar16) = 0;
              }
              lVar17 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 2;
              auVar19._8_8_ = lVar17 + 2;
              uVar16 = uVar16 + 0x20;
            } while ((ulong)(uVar13 + 1 >> 1) << 5 != uVar16);
          }
          iVar11 = sigdata_00->n_samples;
          pIVar6 = (IT_SAMPLE *)malloc((long)iVar11 * 0x68);
          sigdata_00->sample = pIVar6;
          if (pIVar6 != (IT_SAMPLE *)0x0) {
            if (0 < iVar11) {
              uVar16 = 0;
              lVar17 = 0;
              do {
                pIVar6 = sigdata_00->sample;
                puVar7 = pIVar6->filename + uVar16 + 0x35;
                puVar7[0] = '\0';
                puVar7[1] = '\0';
                puVar7[2] = '\0';
                puVar7[3] = '\0';
                puVar7[4] = '\0';
                puVar7[5] = '\0';
                puVar7[6] = '\0';
                puVar7[7] = '\0';
                pIVar6->filename[uVar16 + 0xf] = '\0';
                pIVar6->name[uVar16] = '\0';
                lVar17 = lVar17 + 1;
                uVar16 = uVar16 + 0x68;
              } while (lVar17 < sigdata_00->n_samples);
              uVar14 = stream->chunk_count;
            }
            if (uVar14 != 0) {
              lVar17 = 8;
              uVar15 = 0;
              do {
                prVar1 = stream->chunks;
                iVar11 = *(int *)((long)prVar1 + lVar17 + -8);
                if (iVar11 == 0x494e5354) {
                  iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4) + 1,0);
                  if (iVar11 != 0) goto LAB_005ada74;
                  pIVar6 = sigdata_00->sample;
                  iVar11 = dumbfile_getc(f);
                  pIVar6 = pIVar6 + iVar11;
                  if (0x120 < *(uint *)((long)&prVar1->type + lVar17)) {
                    iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4) + 0xe1,0);
                    if (iVar11 != 0) goto LAB_005ada74;
                    iVar4 = dumbfile_mgetl(f);
                    if (iVar4 == 0x53414d50) {
                      iVar4 = dumbfile_igetl(f);
                      iVar11 = it_riff_am_process_sample(pIVar6,f,iVar4,(int)uVar16);
                      goto LAB_005ad935;
                    }
                  }
                  dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4) + 2,0);
                  dumbfile_getnc((char *)pIVar6,0x1c,f);
                  pIVar6->name[0x1c] = '\0';
                }
                else if (iVar11 == 0x50415454) {
                  iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4),0);
                  if (iVar11 != 0) goto LAB_005ada74;
                  iVar11 = dumbfile_getc(f);
                  iVar4 = dumbfile_igetl(f);
                  uVar16 = 0;
                  iVar11 = it_riff_am_process_pattern(sigdata_00->pattern + iVar11,f,iVar4,0);
LAB_005ad935:
                  if (iVar11 != 0) goto LAB_005ada74;
                }
                else if (iVar11 == 0x4f524452) {
                  iVar11 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar17 + -4),0);
                  if (iVar11 != 0) goto LAB_005ada74;
                  iVar3 = dumbfile_getc(f);
                  iVar11 = iVar3 + 1;
                  sigdata_00->n_orders = iVar11;
                  if (*(uint *)((long)&prVar1->type + lVar17) < iVar3 + 2U) goto LAB_005ada74;
                  puVar7 = (uchar *)malloc((long)iVar11);
                  sigdata_00->order = puVar7;
                  if (puVar7 == (uchar *)0x0) goto LAB_005ada74;
                  dumbfile_getnc((char *)puVar7,iVar11,f);
                }
                uVar15 = uVar15 + 1;
                lVar17 = lVar17 + 0x18;
              } while (uVar15 < stream->chunk_count);
            }
            _dumb_it_fix_invalid_orders(sigdata_00);
            local_58 = "TITLE";
            local_48 = "FORMAT";
            local_40 = "RIFF AMFF";
            local_60 = sigdata_00;
            local_50 = sigdata_00;
            pDVar8 = make_duh(0,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
            return pDVar8;
          }
        }
LAB_005ada74:
        _dumb_it_unload_sigdata(sigdata_00);
        return (DUH *)0x0;
      }
    }
LAB_005ad71b:
    free(sigdata_00);
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_amff( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;
	long length;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_amff_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	length = 0;/*_dumb_it_build_checkpoints(sigdata, 0);*/

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AMFF";
		return make_duh( length, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}